

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void __thiscall
Solver_MCSVM_CS::solve_sub_problem
          (Solver_MCSVM_CS *this,double A_i,int yi,double C_yi,int active_i,double *alpha_new)

{
  size_t __n;
  double *pdVar1;
  double *__dest;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pdVar1 = this->B;
  __n = (long)active_i * 8;
  uVar4 = 0xffffffffffffffff;
  if (-1 < active_i) {
    uVar4 = __n;
  }
  __dest = (double *)operator_new__(uVar4);
  memcpy(__dest,pdVar1,__n);
  if (yi < active_i) {
    __dest[yi] = __dest[yi] + A_i * C_yi;
  }
  uVar4 = (ulong)(uint)active_i;
  qsort(__dest,(long)active_i,8,compare_double);
  dVar5 = *__dest - A_i * C_yi;
  if (active_i < 2) {
    dVar6 = 1.0;
  }
  else {
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      if ((double)(int)uVar2 * __dest[uVar2] <= dVar5) break;
      dVar5 = dVar5 + __dest[uVar2];
      uVar2 = uVar2 + 1;
      uVar3 = uVar4;
    } while (uVar4 != uVar2);
    dVar6 = (double)(int)uVar3;
  }
  if (0 < active_i) {
    pdVar1 = this->B;
    uVar2 = 0;
    do {
      dVar7 = C_yi;
      if ((uint)yi != uVar2) {
        dVar7 = 0.0;
      }
      dVar8 = (dVar5 / dVar6 - pdVar1[uVar2]) / A_i;
      if (dVar8 <= dVar7) {
        dVar7 = dVar8;
      }
      alpha_new[uVar2] = dVar7;
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
  }
  operator_delete__(__dest);
  return;
}

Assistant:

void Solver_MCSVM_CS::solve_sub_problem(double A_i, int yi, double C_yi, int active_i, double *alpha_new)
{
	int r;
	double *D;

	clone(D, B, active_i);
	if(yi < active_i)
		D[yi] += A_i*C_yi;
	qsort(D, active_i, sizeof(double), compare_double);

	double beta = D[0] - A_i*C_yi;
	for(r=1;r<active_i && beta<r*D[r];r++)
		beta += D[r];
	beta /= r;

	for(r=0;r<active_i;r++)
	{
		if(r == yi)
			alpha_new[r] = min(C_yi, (beta-B[r])/A_i);
		else
			alpha_new[r] = min((double)0, (beta - B[r])/A_i);
	}
	delete[] D;
}